

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O0

boolean somexy(level *lev,mkroom *croom,coord *c)

{
  boolean bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int local_30;
  int local_2c;
  int i;
  int try_cnt;
  coord *c_local;
  mkroom *croom_local;
  level *lev_local;
  
  local_2c = 0;
  if (croom->irregular == '\0') {
    if (croom->nsubrooms == '\0') {
      iVar4 = somex(croom);
      c->x = (xchar)iVar4;
      iVar4 = somey(croom);
      c->y = (xchar)iVar4;
      lev_local._7_1_ = '\x01';
    }
    else {
      while (iVar4 = local_2c + 1, local_2c < 100) {
        iVar3 = somex(croom);
        c->x = (xchar)iVar3;
        iVar3 = somey(croom);
        c->y = (xchar)iVar3;
        local_2c = iVar4;
        if ((lev->locations[c->x][c->y].typ == '\0') || ('\f' < lev->locations[c->x][c->y].typ)) {
          local_30 = 0;
          while( true ) {
            if (croom->nsubrooms <= local_30) goto LAB_0024331f;
            bVar1 = inside_room(croom->sbrooms[local_30],c->x,c->y);
            if (bVar1 != '\0') break;
            local_30 = local_30 + 1;
          }
        }
      }
LAB_0024331f:
      if (iVar4 < 100) {
        lev_local._7_1_ = '\x01';
      }
      else {
        lev_local._7_1_ = '\0';
      }
    }
  }
  else {
    uVar2 = (int)(((long)croom - (long)lev->rooms) / 0xd8) + 3;
    do {
      iVar4 = local_2c + 1;
      if (99 < local_2c) {
        c->x = croom->lx;
        do {
          if (croom->hx < c->x) {
            return '\0';
          }
          c->y = croom->ly;
          while (c->y <= croom->hy) {
            if (((*(uint *)&lev->locations[c->x][c->y].field_0x6 >> 0x16 & 1) == 0) &&
               ((*(uint *)&lev->locations[c->x][c->y].field_0x6 >> 0x10 & 0x3f) == uVar2)) {
              return '\x01';
            }
            c->y = c->y + '\x01';
          }
          c->x = c->x + '\x01';
        } while( true );
      }
      iVar3 = somex(croom);
      c->x = (xchar)iVar3;
      iVar3 = somey(croom);
      c->y = (xchar)iVar3;
      local_2c = iVar4;
    } while (((*(uint *)&lev->locations[c->x][c->y].field_0x6 >> 0x16 & 1) != 0) ||
            ((*(uint *)&lev->locations[c->x][c->y].field_0x6 >> 0x10 & 0x3f) != uVar2));
    lev_local._7_1_ = '\x01';
  }
  return lev_local._7_1_;
}

Assistant:

boolean somexy(struct level *lev, struct mkroom *croom, coord *c)
{
	int try_cnt = 0;
	int i;

	if (croom->irregular) {
	    i = (croom - lev->rooms) + ROOMOFFSET;

	    while (try_cnt++ < 100) {
		c->x = somex(croom);
		c->y = somey(croom);
		if (!lev->locations[c->x][c->y].edge &&
			(int) lev->locations[c->x][c->y].roomno == i)
		    return TRUE;
	    }
	    /* try harder; exhaustively search until one is found */
	    for (c->x = croom->lx; c->x <= croom->hx; c->x++)
		for (c->y = croom->ly; c->y <= croom->hy; c->y++)
		    if (!lev->locations[c->x][c->y].edge &&
			    (int) lev->locations[c->x][c->y].roomno == i)
			return TRUE;
	    return FALSE;
	}

	if (!croom->nsubrooms) {
		c->x = somex(croom);
		c->y = somey(croom);
		return TRUE;
	}

	/* Check that coords doesn't fall into a subroom or into a wall */

	while (try_cnt++ < 100) {
		c->x = somex(croom);
		c->y = somey(croom);
		if (IS_WALL(lev->locations[c->x][c->y].typ))
		    continue;
		for (i=0; i < croom->nsubrooms; i++)
		    if (inside_room(croom->sbrooms[i], c->x, c->y))
			goto you_lose;
		break;
you_lose:	;
	}
	if (try_cnt >= 100)
	    return FALSE;
	return TRUE;
}